

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O2

void __thiscall RVO::Agent::insertAgentNeighbor(Agent *this,Agent *agent,float *rangeSq)

{
  ulong uVar1;
  pointer ppVar2;
  ulong uVar3;
  Agent **ppAVar4;
  float fVar5;
  float fVar6;
  pair<float,_const_RVO::Agent_*> local_28;
  
  if ((this != agent) &&
     (fVar6 = (this->position_).x_ - (agent->position_).x_,
     fVar5 = (this->position_).y_ - (agent->position_).y_, fVar5 = fVar6 * fVar6 + fVar5 * fVar5,
     fVar5 < *rangeSq)) {
    ppVar2 = (this->agentNeighbors_).
             super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = (long)(this->agentNeighbors_).
                  super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4;
    if (uVar1 < this->maxNeighbors_) {
      local_28.first = fVar5;
      local_28.second = agent;
      std::
      vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
      ::emplace_back<std::pair<float,RVO::Agent_const*>>
                ((vector<std::pair<float,RVO::Agent_const*>,std::allocator<std::pair<float,RVO::Agent_const*>>>
                  *)this,&local_28);
      ppVar2 = (this->agentNeighbors_).
               super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (long)(this->agentNeighbors_).
                    super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4;
    }
    uVar3 = 1;
    for (ppAVar4 = &ppVar2[uVar1 - 1].second; (uVar1 != uVar3 && (fVar5 < *(float *)(ppAVar4 + -3)))
        ; ppAVar4 = ppAVar4 + -2) {
      ((pair<float,_const_RVO::Agent_*> *)(ppAVar4 + -1))->first = *(float *)(ppAVar4 + -3);
      *ppAVar4 = ppAVar4[-2];
      uVar3 = uVar3 + 1;
    }
    ((pair<float,_const_RVO::Agent_*> *)(ppAVar4 + -1))->first = fVar5;
    *ppAVar4 = agent;
    if (uVar1 == this->maxNeighbors_) {
      *rangeSq = (this->agentNeighbors_).
                 super__Vector_base<std::pair<float,_const_RVO::Agent_*>,_std::allocator<std::pair<float,_const_RVO::Agent_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    }
  }
  return;
}

Assistant:

void Agent::insertAgentNeighbor(const Agent *agent, float &rangeSq)
	{
		if (this != agent) {
			const float distSq = absSq(position_ - agent->position_);

			if (distSq < rangeSq) {
				if (agentNeighbors_.size() < maxNeighbors_) {
					agentNeighbors_.push_back(std::make_pair(distSq, agent));
				}

				size_t i = agentNeighbors_.size() - 1;

				while (i != 0 && distSq < agentNeighbors_[i - 1].first) {
					agentNeighbors_[i] = agentNeighbors_[i - 1];
					--i;
				}

				agentNeighbors_[i] = std::make_pair(distSq, agent);

				if (agentNeighbors_.size() == maxNeighbors_) {
					rangeSq = agentNeighbors_.back().first;
				}
			}
		}
	}